

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxPreIncrDecr::Emit(FxPreIncrDecr *this,VMFunctionBuilder *build)

{
  byte bVar1;
  PType *pPVar2;
  int iVar3;
  uint opc;
  uint uVar4;
  uint opc_00;
  ExpEmit EVar5;
  ulong uVar6;
  ExpEmit *pEVar7;
  ExpEmit value;
  ExpEmit pointer;
  byte local_6a;
  byte local_68;
  byte local_64;
  uint local_60;
  ExpEmit local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ExpEmit local_38;
  uint extraout_var;
  
  if (1 < this->Token - 0x119U) {
    __assert_fail("Token == TK_Incr || Token == TK_Decr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80d,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  pPVar2 = (this->super_FxExpression).ValueType;
  if (pPVar2 != this->Base->ValueType) {
LAB_00523125:
    __assert_fail("ValueType == Base->ValueType && IsNumeric()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80e,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  iVar3 = (*(pPVar2->super_PTypeBase).super_DObject._vptr_DObject[8])();
  if ((char)iVar3 == '\0') goto LAB_00523125;
  opc = VMFunctionBuilder::GetConstantInt(build,0);
  bVar1 = ((this->super_FxExpression).ValueType)->RegType;
  EVar5._0_4_ = (*this->Base->_vptr_FxExpression[9])(this->Base,build);
  EVar5.Konst = (bool)(char)extraout_var;
  EVar5.Fixed = (bool)(char)(extraout_var >> 8);
  EVar5.Final = (bool)(char)(extraout_var >> 0x10);
  EVar5.Target = (bool)(char)(extraout_var >> 0x18);
  local_48 = (ulong)(extraout_var >> 8);
  local_40 = (ulong)EVar5 >> 0x10;
  local_50 = (ulong)EVar5 >> 0x18;
  local_58 = EVar5;
  local_38 = EVar5;
  if ((extraout_var & 0x1000000) == 0) {
    local_68 = 1;
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,1);
    local_58 = (ExpEmit)((ulong)((uint)bVar1 << 0x10 | uVar4 & 0xffff) | 0x1000000);
    VMFunctionBuilder::Emit
              (build,(uint)((this->super_FxExpression).ValueType)->loadOp,uVar4 & 0xffff,
               EVar5._0_4_ & 0xffff,opc);
    local_60 = 0;
    local_64 = 0;
    local_6a = bVar1;
  }
  else {
    local_68 = (byte)(EVar5._0_4_ >> 0x18);
    local_6a = (byte)(EVar5._0_4_ >> 0x10);
    local_64 = (byte)(extraout_var >> 8);
    uVar4 = EVar5._0_4_;
    local_60 = extraout_var;
  }
  uVar4 = uVar4 & 0xffff;
  if (bVar1 == 0) {
    opc_00 = 0xff;
    if (this->Token == 0x119) {
      opc_00 = 1;
    }
    iVar3 = 0x65;
  }
  else {
    iVar3 = (uint)(this->Token != 0x119) * 2 + 0x98;
    opc_00 = VMFunctionBuilder::GetConstantFloat(build,1.0);
  }
  VMFunctionBuilder::Emit(build,iVar3,uVar4,uVar4,opc_00);
  if ((extraout_var & 0x1000000) == 0) {
    VMFunctionBuilder::Emit
              (build,(uint)((this->super_FxExpression).ValueType)->storeOp,EVar5._0_4_ & 0xffff,
               uVar4,opc);
  }
  if (this->AddressRequested == true) {
    pEVar7 = &local_38;
    if ((((local_64 | (byte)local_60) & 1) != 0) || (3 < local_6a)) goto LAB_00523113;
    uVar6 = (ulong)local_6a;
  }
  else {
    pEVar7 = &local_58;
    if ((((byte)extraout_var | (byte)local_48) & 1) != 0 || 3 < (byte)local_40) goto LAB_00523113;
    uVar6 = (ulong)((uint)local_40 & 3);
    uVar4 = EVar5._0_4_ & 0xffff;
    local_68 = (byte)local_50;
  }
  VMFunctionBuilder::RegAvailability::Return(build->Registers + uVar6,uVar4,(uint)local_68);
LAB_00523113:
  return *pEVar7;
}

Assistant:

ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *build)
{
	assert(Token == TK_Incr || Token == TK_Decr);
	assert(ValueType == Base->ValueType && IsNumeric());

	int zero = build->GetConstantInt(0);
	int regtype = ValueType->GetRegType();
	ExpEmit pointer = Base->Emit(build);
	ExpEmit value = pointer;

	if (!pointer.Target)
	{
		value = ExpEmit(build, regtype);
		build->Emit(ValueType->GetLoadOp(), value.RegNum, pointer.RegNum, zero);
	}

	if (regtype == REGT_INT)
	{
		build->Emit(OP_ADDI, value.RegNum, value.RegNum, uint8_t((Token == TK_Incr) ? 1 : -1));
	}
	else
	{
		build->Emit((Token == TK_Incr) ? OP_ADDF_RK : OP_SUBF_RK, value.RegNum, value.RegNum, build->GetConstantFloat(1.));
	}

	if (!pointer.Target)
	{
		build->Emit(ValueType->GetStoreOp(), pointer.RegNum, value.RegNum, zero);
	}

	if (AddressRequested)
	{
		value.Free(build);
		return pointer;
	}

	pointer.Free(build);
	return value;
}